

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBEx.cpp
# Opt level: O0

string * __thiscall ADSBExchangeConnection::GetStatusText_abi_cxx11_(ADSBExchangeConnection *this)

{
  byte bVar1;
  long *in_RSI;
  string *in_RDI;
  char t [25];
  string *s;
  string local_88 [32];
  long in_stack_ffffffffffffff98;
  char local_48 [48];
  uint7 in_stack_ffffffffffffffe8;
  
  LTChannel::GetStatusText_abi_cxx11_((LTChannel *)(ulong)in_stack_ffffffffffffffe8);
  bVar1 = (**(code **)(*in_RSI + 0x30))();
  if ((((bVar1 & 1) != 0) && (bVar1 = (**(code **)(*in_RSI + 0x50))(), (bVar1 & 1) != 0)) &&
     (0 < dataRefs.ADSBExRLimit)) {
    local_48[0x10] = 0;
    local_48[0x11] = '\0';
    local_48[0x12] = '\0';
    local_48[0x13] = '\0';
    local_48[0x14] = '\0';
    local_48[0x15] = '\0';
    local_48[0x16] = '\0';
    local_48[0x17] = '\0';
    local_48[0x18] = '\0';
    local_48[0] = '\0';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    local_48[8] = 0;
    local_48[9] = '\0';
    local_48[10] = '\0';
    local_48[0xb] = '\0';
    local_48[0xc] = '\0';
    local_48[0xd] = '\0';
    local_48[0xe] = '\0';
    local_48[0xf] = '\0';
    std::__cxx11::string::operator+=((string *)in_RDI," | ");
    std::__cxx11::to_string(in_stack_ffffffffffffff98);
    std::__cxx11::string::operator+=((string *)in_RDI,(string *)&stack0xffffffffffffff98);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
    std::__cxx11::string::operator+=((string *)in_RDI," of ");
    std::__cxx11::to_string(in_stack_ffffffffffffff98);
    std::__cxx11::string::operator+=((string *)in_RDI,local_88);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::operator+=((string *)in_RDI," RAPID API requests left, resets in ");
    if (dataRefs.ADSBExRReset < 0x2a301) {
      if (dataRefs.ADSBExRReset < 0x1c21) {
        snprintf(local_48,0x19,"%.1f minutes",SUB84((double)((float)dataRefs.ADSBExRReset / 60.0),0)
                );
      }
      else {
        snprintf(local_48,0x19,"%.1f hours",SUB84((double)((float)dataRefs.ADSBExRReset / 3600.0),0)
                );
      }
    }
    else {
      snprintf(local_48,0x19,"%.1f days",SUB84((double)((float)dataRefs.ADSBExRReset / 86400.0),0));
    }
    std::__cxx11::string::operator+=((string *)in_RDI,local_48);
  }
  return in_RDI;
}

Assistant:

std::string ADSBExchangeConnection::GetStatusText () const
{
    std::string s = LTChannel::GetStatusText();
    if (IsValid() && IsEnabled() && dataRefs.ADSBExRLimit > 0)
    {
        char t[25] = "";
        s += " | ";
        s += std::to_string(dataRefs.ADSBExRRemain);
        s += " of ";
        s += std::to_string(dataRefs.ADSBExRLimit);
        s += " RAPID API requests left, resets in ";
        if (dataRefs.ADSBExRReset > 48*60*60)           // more than 2 days
            snprintf(t, sizeof(t), "%.1f days",
                    float(dataRefs.ADSBExRReset) / (24.0f*60.0f*60.0f));
        else if (dataRefs.ADSBExRReset >  2*60*60)      // more than 2 hours
            snprintf(t, sizeof(t), "%.1f hours",
                    float(dataRefs.ADSBExRReset) / (      60.0f*60.0f));
        else                                            // less than 2 hours
            snprintf(t, sizeof(t), "%.1f minutes",
                    float(dataRefs.ADSBExRReset) / (            60.0f));
        s += t;
    }
    return s;
}